

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

bool __thiscall ON_Leader::SetPoint2d(ON_Leader *this,int idx,ON_2dPoint point)

{
  int iVar1;
  ON_2dPoint *pOVar2;
  int idx_local;
  ON_Leader *this_local;
  ON_2dPoint point_local;
  
  if ((-1 < idx) &&
     (iVar1 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>),
     idx < iVar1)) {
    pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,idx);
    pOVar2->x = point.x;
    pOVar2->y = point.y;
    if (this->m_curve != (ON_NurbsCurve *)0x0) {
      if (this->m_curve != (ON_NurbsCurve *)0x0) {
        (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      this->m_curve = (ON_NurbsCurve *)0x0;
    }
    InvalidateTextPoint(this);
    return true;
  }
  return false;
}

Assistant:

bool ON_Leader::SetPoint2d(int idx, ON_2dPoint point)
{
  if (idx >= 0 && idx < m_points.Count())
  {
    m_points[idx] = point;
    if (nullptr != m_curve)
    {
      delete m_curve;
      m_curve = nullptr;
    }
    InvalidateTextPoint();
    return true;
  }
  return false;
}